

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::performTask(HierarchicalTaskNetworkComponent *this,float dt)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  pointer pTVar4;
  reference __args_2;
  World *this_00;
  GameMode *this_01;
  reference pvVar5;
  reference pvVar6;
  TaskParameters *parameters;
  string local_38;
  Bark local_18;
  float local_14;
  Bark bark;
  float dt_local;
  HierarchicalTaskNetworkComponent *this_local;
  
  if ((((this->planner).plan.failed & 1U) == 0) && (((this->planner).plan.finished & 1U) == 0)) {
    local_14 = dt;
    _bark = this;
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->(&(this->planner).plan.currentTask);
    bVar3 = std::function::operator_cast_to_bool((function *)&pTVar4->loop);
    if (bVar3) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->(&(this->planner).plan.currentTask);
      __args_2 = __gnu_cxx::
                 __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
                 operator*(&(this->planner).plan.currentTask);
      std::function<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&)>::operator()
                (&pTVar4->loop,&this->state,&this->worldQuerySystem,__args_2);
    }
    pTVar4 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->(&(this->planner).plan.currentTask);
    fVar1 = local_14;
    switch(pTVar4->action) {
    case SelectDestination:
      break;
    case MoveToPlayer:
      break;
    case MoveToDestination:
      break;
    case MoveToActor:
      break;
    case StopMoving:
      break;
    case Wait:
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->(&(this->planner).plan.currentTask);
      pvVar6 = std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::operator[]
                         (&(pTVar4->parameters).vectors,0);
      pvVar6->x = fVar1 + pvVar6->x;
      break;
    case BotherPlayer:
      break;
    case Bark:
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->(&(this->planner).plan.currentTask);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&(pTVar4->parameters).values,0);
      local_18 = (Bark)*pvVar5;
      this_00 = Component::getWorld(&this->super_Component);
      this_01 = World::getAuthGameMode(this_00);
      GameMode::getBarkString_abi_cxx11_(&local_38,this_01,local_18);
      Barker::bark(&this->barker,&local_38,5.0);
      std::__cxx11::string::~string((string *)&local_38);
      break;
    case PlayMontage:
      break;
    case PlayAnimation:
      pTVar4 = __gnu_cxx::
               __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
               operator->(&(this->planner).plan.currentTask);
      fVar1 = local_14;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&(pTVar4->parameters).values,2);
      fVar2 = local_14;
      *pvVar5 = fVar1 + *pvVar5;
      pvVar6 = std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::operator[]
                         (&(pTVar4->parameters).vectors,0);
      pvVar6->x = fVar2 + pvVar6->x;
      break;
    case FocusPlayer:
      break;
    case LookAt:
    }
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::performTask(float dt)
{
	if (planner.plan.failed || planner.plan.finished)
		return;

	if (planner.plan.currentTask->loop)
	{		
		planner.plan.currentTask->loop(state, worldQuerySystem, *planner.plan.currentTask);
	}

	switch(planner.plan.currentTask->action)
	{
		case Action::SelectDestination
			:
		{
			/*auto navSystem = UNavigationSystem::GetCurrent(getWorld());
			FNavLocation location;

			switch(static_cast<DestinationType>(static_cast<int>(planner.plan.currentTask->parameters.values[0])))
			{
				case DestinationType::RandomLocation
					:
				{
					auto currentPosition = state.current.vectors[WorldStateIdentifier::CurrentPosition];
					navSystem->GetRandomReachablePointInRadius(currentPosition, 1000, location);
					break;
				}
				case DestinationType::RandomStack
					:
				{
					auto& stacks = static_cast<APlayGameState*>(getWorld()->GetGameState())->getStacks();
					auto randomIndex = std::uniform_int_distribution<int32>{0, static_cast<int>(stacks.size()) - 1}(eng);
					
					auto stackPosition = stacks[randomIndex]->GetActorLocation();
					auto forward = stacks[randomIndex]->GetActorForwardVector() * -100.f;
					navSystem->ProjectPointToNavigation(stackPosition + forward, location);
					DrawDebugBox(getWorld(), stackPosition + forward, {100.f, 100.f, 100.f}, FColor::White, true);

					break;
				}
			}			
				
			state.current.vectors[WorldStateIdentifier::Destination] = location.Location;
			*/
			break;
		}
		case Action::MoveToPlayer
			:
		{
			/*auto player = static_cast<AWoodenSphereCharacter*>(getWorld()->GetFirstPlayerController()->GetCharacter());

			auto& currentPosition = state.current.vectors.at(WorldStateIdentifier::CurrentPosition);
			auto& playerPosition = state.current.vectors.at(WorldStateIdentifier::PlayerPosition);

			auto maxDist = 1000000.f;
			auto alpha = FMath::Min(FMath::Max(distanceSquared(currentPosition, playerPosition), MinDistanceToPlayer), maxDist - MinDistanceToPlayer) / (maxDist - MinDistanceToPlayer);
			float speed = 0.f;

			if (alpha >= 1.f)
			{
				speed = 600.f;
			}
			else if (alpha >= 0.75)
			{
				speed = 500.f;
			}
			else if (alpha >= 0.25)
			{
				speed = 300.f;
			}
			else
			{
				speed = 100.f;
			}

			AIOwner->SetFocus(player);
			AIOwner->GetCharacter()->GetCharacterMovement()->MaxWalkSpeed = FMath::InterpEaseInOut(100, 600, alpha, 1.f);
			AIOwner->MoveToLocation(state.current.vectors[WorldStateIdentifier::PlayerPosition], 2);
			*/
			break;
		}
		case Action::MoveToDestination
			:
		{			
			//TODO: should only move once per task, use the same method as should PlayAnimation play (check a float value)
			/*AIOwner->ClearFocus(EAIFocusPriority::Gameplay);
			AIOwner->GetCharacter()->GetCharacterMovement()->MaxWalkSpeed = planner.plan.currentTask->parameters.values[0];
			
			//if (planner.plan.currentTask->parameters.values[1] == 1.f)
			{
				auto& args = planner.plan.currentTask->parameters.vectors[0];
				AIOwner->MoveToLocation(state.current.vectors[WorldStateIdentifier::Destination], args.x, args.y > 0.f, args.z > 0.f);//2);
				planner.plan.currentTask->parameters.values[1] = 0.f;
			}		

			auto colour = FColor::Yellow;

			if (!planner.plan.currentTask->parameters.vectors.empty())
			{
				//colour = FColor(LinearColor(planner.plan.currentTask->parameters.vectors[0]));
				colour = LinearColor(planner.plan.currentTask->parameters.vectors[0]).ToFColor(true); 
			}
			
			if (planner.plan.currentTask->parameters.values[1] == 1.f)
			{
				DrawDebugSphere(getWorld(), state.current.vectors[WorldStateIdentifier::Destination], 50, 16, colour, false, 60);
				planner.plan.currentTask->parameters.values[1] = 0.f;
			}
			*/
			break;
		}
		case Action::MoveToActor
			:
		{			
			//TODO: should only move once per task, use the same method as should PlayAnimation play (check a float value)
			/*AIOwner->ClearFocus(EAIFocusPriority::Gameplay);
			AIOwner->GetCharacter()->GetCharacterMovement()->MaxWalkSpeed = planner.plan.currentTask->parameters.values[0];
			
			if (planner.plan.currentTask->parameters.values[1] == 1.f)
			{
				auto& args = planner.plan.currentTask->parameters.vectors[0];
				
				auto conversationPartner = Cast<AAICharacter>(state.blackboard->GetValueAsObject({*UEnum::GetValueAsString(TEXT("/Script/WoodenSphere.EBlackboardKey"), EBlackboardKey::ConversationPartner)}));

				AIOwner->MoveToActor(conversationPartner, args.x, args.y > 0.f, args.z > 0.f);//2);
				planner.plan.currentTask->parameters.values[1] = 0.f;
			}*/							

			break;
		}
		case Action::StopMoving
			:
		{
			//AIOwner->StopMovement();
			
			break;
		}		
		case Action::Wait
			:
		{
			//planner.plan.currentTask->parameters.values[0] += dt;
			planner.plan.currentTask->parameters.vectors[0].x += dt;
			break;
		}
		case Action::BotherPlayer
			:
		{
			/*auto player = static_cast<AWoodenSphereCharacter*>(getWorld()->GetFirstPlayerController()->GetCharacter());

			if (!player) return;

			player->stress+=25;
			player->TakeDamage(0.1f, {}, GetOwner()->GetInstigatorController(), GetOwner());
			*/
			break;
		}
		case Action::Bark
			:
		{			
			auto bark = static_cast<Bark>(static_cast<int>(planner.plan.currentTask->parameters.values[0]));
			barker.bark(getWorld()->getAuthGameMode()->getBarkString(bark));

			break;
		}
		case Action::PlayMontage
			:
		{
			/*auto animInstance = AIOwner->GetCharacter()->GetMesh()->AnimScriptInstance;
			auto& parameters = planner.plan.currentTask->parameters;

			switch(static_cast<Montage>(static_cast<int>(planner.plan.currentTask->parameters.values[2])))
			{
				case Montage::Stare
					:
				{
					auto stareMontage = static_cast<AAICharacter*>(AIOwner->GetCharacter())->stareMontage;

					if (!parameters.values[1]) //3
					{
						parameters.values[1] = 1; //3
						animInstance->Montage_Play(stareMontage);
					}
					else if(!animInstance->Montage_IsPlaying(stareMontage))
					{
						//parameters.values[0] = 1;	
						parameters.vectors[0].x = 1;
					}		
					else if (state.current.flags[WorldStateIdentifier::PlayerIdentified])
					{
						animInstance->Montage_SetNextSection({"StareLoop"}, {"PlayerIdentified"});
					}
					else if (parameters.values[2] > 5.f) //4
					{
						animInstance->Montage_SetNextSection({"StareLoop"}, {"PlayerNotIdentified"});
					}

					break;
				}
				case Montage::LookAround
					:
				{
					auto lookAroundMontage = static_cast<AAICharacter*>(AIOwner->GetCharacter())->lookAroundMontage;

					if (!parameters.values[1]) //3
					{
						parameters.values[1] = 1;
						animInstance->Montage_Play(lookAroundMontage);
					}
					else if(!animInstance->Montage_IsPlaying(lookAroundMontage))
					{
						//parameters.values[0] = 1;	
						parameters.vectors[0].x = 1;
					}		
					else if (state.current.flags[WorldStateIdentifier::PlayerIdentified])
					{
						animInstance->Montage_SetNextSection({"StareLoop"}, {"PlayerIdentified"});
						animInstance->Montage_JumpToSectionsEnd({"Default"});
					}					

					break;
				}
			}

			parameters.values[2] += dt; //4
*/
			break;
		}
		case Action::PlayAnimation
			:
		{
			auto& parameters = planner.plan.currentTask->parameters;

			/*auto character = Cast<AAICharacter>(AIOwner->GetCharacter());
			character->isSitting = !character->isSitting;//true;*/
			/*auto skeletalMeshComponent = character->FindComponentByClass<USkeletalMeshComponent>();

			if (parameters.values[1] == static_cast<float>(EAnimationPlayerState::NeedsToStart))
			{
				parameters.values[1] = static_cast<float>(EAnimationPlayerState::HasStarted);
				EAnimationId animationId {static_cast<EAnimationId>(roundToInt(parameters.values[0]))};
				auto animation = character->animations.FindByPredicate([=](auto& anim) {return anim.id == animationId;});
				skeletalMeshComponent->PlayAnimation(animation->animation, false);
				//parameters.values[1] = skeletalMeshComponent->GetSingleNodeInstance()->GetLength();				

				auto l = parameters.vectors[0].y = skeletalMeshComponent->GetSingleNodeInstance()->GetLength();	
				if (parameters.values[3] == static_cast<float>(EAnimationType::BlendSpace))
				{
					skeletalMeshComponent->GetSingleNodeInstance()->SetBlendSpaceInput(parameters.vectors[2]);
				}
				parameters.vectors[0].y = skeletalMeshComponent->GetSingleNodeInstance()->GetLength();				
			}

			if (parameters.values[3] == static_cast<float>(EAnimationType::BlendSpace))
			{
				skeletalMeshComponent->GetSingleNodeInstance()->SetBlendSpaceInput(parameters.vectors[2]);
			}		*/			

			parameters.values[2] += dt;
			//parameters.values[0] += dt;
			parameters.vectors[0].x += dt;

			break;
		}
		case Action::FocusPlayer
			:
		{
			/*auto player = static_cast<AWoodenSphereCharacter*>(getWorld()->GetFirstPlayerController()->GetCharacter());

			AIOwner->SetFocus(player);
			*/
			break;
		}
		case Action::LookAt
			:
		{
			/*auto lookAt = planner.plan.currentTask->parameters.vectors[1];
			auto needToCalc = planner.plan.currentTask->parameters.values[0];

			if (needToCalc == 0.f)
			{				
				auto rotation = (GetOwner()->GetActorLocation() - lookAt).Rotation();
				auto rotator = rotation;
				rotator.Pitch = 0;
				rotator.Roll = 0;
				lookAt = rotator.Vector();
			
				planner.plan.currentTask->parameters.values[0] = 1.f;
			}

			auto& interpDt = planner.plan.currentTask->parameters.vectors[0].x;//values[0];
			
			auto v = lookAt - GetOwner()->GetActorLocation();
			v.normalize();
			auto dot = dot(v, GetOwner()->GetActorForwardVector());

			if (FMath::IsNearlyEqual(dot, -1.f))
			{
				interpDt = 1;
			}
			else
			{
				FRotator r;
				r.yaw = 1 * dot > 1 ? 1 : -1;
				r.Roll = 0;
				r.Pitch = 0;
				GetOwner()->AddActorWorldRotation(r);
				AIOwner->GetPawn()->AddActorWorldRotation(r);
			}
			*/
			break;
		}
	}
}